

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O2

int Zyx_TestReadNode(char *pLine,Vec_Wrd_t *vTruths,int nVars,int nLutSize,int iObj)

{
  char cVar1;
  word *pIn1;
  size_t sVar2;
  word *pwVar3;
  byte bVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  int in_R9D;
  ulong uVar10;
  ulong uVar11;
  word *pFaninsW [6];
  
  bVar4 = (char)nVars - 6;
  iVar6 = 1 << (bVar4 & 0x1f);
  if (nVars < 7) {
    iVar6 = 1;
  }
  bVar9 = 0;
  if (6 < nVars) {
    bVar9 = bVar4;
  }
  pIn1 = Vec_WrdEntryP(vTruths,vTruths->nSize / iVar6 + -1 << (bVar9 & 0x1f));
  sVar2 = strlen(pLine);
  if (pLine[sVar2 - 1] == '\n') {
    pLine[sVar2 - 1] = '\0';
  }
  sVar2 = strlen(pLine);
  if (pLine[sVar2 - 1] == '\r') {
    pLine[sVar2 - 1] = '\0';
  }
  cVar1 = *pLine;
  if (cVar1 == '\0') {
    iVar6 = 0;
  }
  else {
    sVar2 = strlen(pLine);
    uVar7 = 1 << ((byte)nLutSize & 0x1f);
    if (nLutSize + uVar7 + 1 == (int)sVar2) {
      if (iObj + 0x41 == (int)cVar1) {
        for (uVar10 = (ulong)(uint)nLutSize; 0 < (int)uVar10; uVar10 = uVar10 - 1) {
          pwVar3 = Vec_WrdEntryP(vTruths,(int)pLine[uVar10 + (long)(int)uVar7] +
                                         (uint)(pLine[uVar10 + (long)(int)uVar7] < 0x61) * 0x20 +
                                         -0x61 << (bVar9 & 0x1f));
          pFaninsW[uVar10 - 1] = pwVar3;
        }
        pwVar3 = Vec_WrdEntryP(vTruths,iObj << (bVar9 & 0x1f));
        Abc_TtConst0(pwVar3,iVar6);
        uVar11 = 0;
        uVar10 = (ulong)(uint)nLutSize;
        if (nLutSize < 1) {
          uVar10 = uVar11;
        }
        uVar8 = 0;
        if (0 < (int)uVar7) {
          uVar8 = (ulong)uVar7;
        }
        for (; uVar11 != uVar8; uVar11 = uVar11 + 1) {
          if (pLine[(long)(int)(uVar7 + ~(uint)uVar11) + 1] != '0') {
            Abc_TtConst1(pIn1,iVar6);
            for (uVar5 = 0; uVar10 != uVar5; uVar5 = uVar5 + 1) {
              Abc_TtAndCompl(pIn1,pIn1,(int)pFaninsW[uVar5],
                             (word *)(ulong)((~(uint)uVar11 >> ((uint)uVar5 & 0x1f) & 1) != 0),iVar6
                             ,in_R9D);
            }
            Abc_TtOr(pwVar3,pwVar3,pIn1,iVar6);
          }
        }
        iVar6 = 1;
      }
      else {
        iVar6 = 0;
        printf("The output node in line %s is not correct.\n",pLine);
      }
    }
    else {
      iVar6 = 0;
      printf("Node representation has %d chars (expecting %d chars).\n",sVar2 & 0xffffffff);
    }
  }
  return iVar6;
}

Assistant:

int Zyx_TestReadNode( char * pLine, Vec_Wrd_t * vTruths, int nVars, int nLutSize, int iObj )
{
    int k, j, nWords = Abc_TtWordNum(nVars);
    word * pFaninsW[6]; char * pTruth, * pFanins;
    word * pThis, * pLast = Zyx_TestTruth( vTruths, Vec_WrdSize(vTruths)/nWords - 1, nWords );
    if ( pLine[strlen(pLine)-1] == '\n' ) pLine[strlen(pLine)-1] = 0;
    if ( pLine[strlen(pLine)-1] == '\r' ) pLine[strlen(pLine)-1] = 0;
    if ( pLine[0] == 0 )
        return 0;
    if ( (int)strlen(pLine) != 1 + nLutSize + (1 << nLutSize) )
    {
        printf( "Node representation has %d chars (expecting %d chars).\n", (int)strlen(pLine), 1 + nLutSize + (1 << nLutSize) );
        return 0;
    }
    if ( pLine[0] != 'A' + iObj )
    {
        printf( "The output node in line %s is not correct.\n", pLine );
        return 0;
    }
    pTruth  = pLine + 1;
    pFanins = pTruth + (1 << nLutSize);
    for ( k = nLutSize - 1; k >= 0; k-- )
        pFaninsW[k] = Zyx_TestTruth( vTruths, pFanins[k] >= 'a' ? pFanins[k] - 'a' : pFanins[k] - 'A', nWords );
    pThis = Zyx_TestTruth(vTruths, iObj, nWords);
    Abc_TtConst0( pThis, nWords );
    for ( k = 0; k < (1 << nLutSize); k++ )
    {
        if ( pTruth[(1 << nLutSize) - 1 - k] == '0' )
            continue;
        Abc_TtConst1( pLast, nWords );
        for ( j = 0; j < nLutSize; j++ )
            Abc_TtAndCompl( pLast, pLast, 0, pFaninsW[j], !((k >> j) & 1), nWords );
        Abc_TtOr( pThis, pThis, pLast, nWords );
    }
    //Dau_DsdPrintFromTruth( pThis, nVars );
    return 1;
}